

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

int main(void)

{
  int qid_00;
  int iVar1;
  char acStack_c3528 [8];
  char msg [800000];
  int qid;
  int vid;
  int len;
  int i;
  
  signal_init();
  ctx = mk_create();
  if (ctx == (mk_ctx_t *)0x0) {
    len = -1;
  }
  else {
    qid_00 = mk_mq_create(ctx,"/data",cb_queue_message,(void *)0x0);
    mk_config_set(ctx,"Listen","9080",0);
    iVar1 = mk_vhost_create(ctx,(char *)0x0);
    mk_vhost_set(ctx,iVar1,"Name","monotop",0);
    mk_vhost_handler(ctx,iVar1,"/api/v1/stream_processor/task/[A-Za-z_][0-9A-Za-z_\\-]*",
                     cb_sp_test_task_detail,(void *)0x0);
    mk_vhost_handler(ctx,iVar1,"/api/v1/stream_processor/task",cb_sp_test_task_main,(void *)0x0);
    mk_vhost_handler(ctx,iVar1,"/test_chunks",cb_test_chunks,(void *)0x0);
    mk_vhost_handler(ctx,iVar1,"/test_big_chunk",cb_test_big_chunk,(void *)0x0);
    mk_vhost_handler(ctx,iVar1,"/",cb_main,(void *)0x0);
    mk_worker_callback(ctx,cb_worker,ctx);
    mk_print(0x1000,"Service: http://%s:%s/test_chunks","127.0.0.1","9080");
    mk_start(ctx);
    for (vid = 0; vid < 5; vid = vid + 1) {
      iVar1 = snprintf(acStack_c3528,799999,"[...] message ID: %i\n",(ulong)(uint)vid);
      mk_mq_send(ctx,qid_00,acStack_c3528,(long)iVar1);
    }
    sleep(0xe10);
    mk_stop(ctx);
    mk_destroy(ctx);
    len = 0;
  }
  return len;
}

Assistant:

int main()
{
    int i = 0;
    int len;
    int vid;
    int qid;
    char msg[800000];

    signal_init();

    ctx = mk_create();
    if (!ctx) {
        return -1;
    }

    /* Create a message queue and a callback for each message */
    qid = mk_mq_create(ctx, "/data", cb_queue_message, NULL);

    mk_config_set(ctx,
                  "Listen", API_PORT,
                  //"Timeout", "1",
                  NULL);

    vid = mk_vhost_create(ctx, NULL);
    mk_vhost_set(ctx, vid,
                 "Name", "monotop",
                 NULL);

    mk_vhost_handler(ctx, vid, "/api/v1/stream_processor/task/[A-Za-z_][0-9A-Za-z_\\-]*",
                     cb_sp_test_task_detail, NULL);

    mk_vhost_handler(ctx, vid, "/api/v1/stream_processor/task",
                     cb_sp_test_task_main, NULL);

    mk_vhost_handler(ctx, vid, "/test_chunks", cb_test_chunks, NULL);
    mk_vhost_handler(ctx, vid, "/test_big_chunk", cb_test_big_chunk, NULL);
    mk_vhost_handler(ctx, vid, "/", cb_main, NULL);


    mk_worker_callback(ctx,
                       cb_worker,
                       ctx);

    mk_info("Service: http://%s:%s/test_chunks",  API_ADDR, API_PORT);
    mk_start(ctx);

    for (i = 0; i < 5; i++) {
        len = snprintf(msg, sizeof(msg) - 1, "[...] message ID: %i\n", i);
        mk_mq_send(ctx, qid, &msg, len);
    }

    sleep(3600);

    mk_stop(ctx);
    mk_destroy(ctx);


    return 0;
}